

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O2

void shar_quote(archive_string *buf,char *str,int in_shell)

{
  char cVar1;
  size_t n;
  char *p;
  
  p = "\"\n\"";
  if (in_shell == 0) {
    p = "\\n";
  }
  for (; cVar1 = *str, cVar1 != '\0'; str = str + n) {
    n = strcspn(str,"\n \t\'`\";&<>()|*?{}[]\\$!#^~");
    if (n == 0) {
      if (cVar1 == '\n') {
        archive_strcat(buf,p);
      }
      else {
        archive_strappend_char(buf,'\\');
        archive_strappend_char(buf,*str);
      }
      n = 1;
    }
    else {
      archive_strncat(buf,str,n);
    }
  }
  return;
}

Assistant:

static void
shar_quote(struct archive_string *buf, const char *str, int in_shell)
{
	static const char meta[] = "\n \t'`\";&<>()|*?{}[]\\$!#^~";
	size_t len;

	while (*str != '\0') {
		if ((len = strcspn(str, meta)) != 0) {
			archive_strncat(buf, str, len);
			str += len;
		} else if (*str == '\n') {
			if (in_shell)
				archive_strcat(buf, "\"\n\"");
			else
				archive_strcat(buf, "\\n");
			++str;
		} else {
			archive_strappend_char(buf, '\\');
			archive_strappend_char(buf, *str);
			++str;
		}
	}
}